

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

bool __thiscall Memory::HeapBlockMap32::TestAndSetMark(HeapBlockMap32 *this,void *address)

{
  L2MapChunk *this_00;
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint i;
  bool bVar4;
  uchar retval;
  
  this_00 = this->map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 == (L2MapChunk *)0x0) {
    bVar4 = false;
  }
  else {
    uVar3 = (uint)address >> 4;
    i = uVar3 & 0xffff;
    BVStatic<65536UL>::AssertRange(&this_00->markBits,i);
    pbVar1 = (byte *)((long)&(this_00->markBits).data[0].word + ((long)(int)i >> 3));
    uVar3 = uVar3 & 7;
    bVar2 = *pbVar1;
    *pbVar1 = *pbVar1 | '\x01' << uVar3;
    bVar4 = (bVar2 >> uVar3 & 1) != 0;
  }
  return bVar4;
}

Assistant:

bool
HeapBlockMap32::TestAndSetMark(void * address)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * chunk = map[id1];
    if (chunk == nullptr)
    {
        // False reference
        return false;
    }

    uint bitIndex = chunk->GetMarkBitIndex(address);
    return (chunk->markBits.TestAndSet(bitIndex) != 0);
}